

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::Add
          (SimpleDescriptorDatabase *this,FileDescriptorProto *file)

{
  bool bVar1;
  FileDescriptorProto *this_00;
  FileDescriptorProto *local_20;
  
  this_00 = (FileDescriptorProto *)operator_new(0xe0);
  FileDescriptorProto::FileDescriptorProto(this_00,(Arena *)0x0);
  FileDescriptorProto::CopyFrom(this_00,file);
  local_20 = this_00;
  std::
  vector<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>>>
  ::emplace_back<google::protobuf::FileDescriptorProto_const*&>
            ((vector<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>>>
              *)&this->files_to_delete_,&local_20);
  bVar1 = DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
                    (&this->index_,local_20,local_20);
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::Add(const FileDescriptorProto& file) {
  FileDescriptorProto* new_file = new FileDescriptorProto;
  new_file->CopyFrom(file);
  return AddAndOwn(new_file);
}